

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcSweptAreaSolid::IfcSweptAreaSolid(IfcSweptAreaSolid *this)

{
  IfcSweptAreaSolid *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x50,"IfcSweptAreaSolid");
  IfcSolidModel::IfcSolidModel(&this->super_IfcSolidModel,&PTR_construction_vtable_24__00fe03c8);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcSweptAreaSolid,_2UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcSweptAreaSolid,_2UL> *)
             &(this->super_IfcSolidModel).super_IfcGeometricRepresentationItem.field_0x30,
             &PTR_construction_vtable_24__00fe0440);
  (this->super_IfcSolidModel).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0xfe0310;
  *(undefined8 *)&this->field_0x50 = 0xfe03b0;
  *(undefined8 *)
   &(this->super_IfcSolidModel).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0xfe0338;
  *(undefined8 *)
   &(this->super_IfcSolidModel).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0xfe0360;
  *(undefined8 *)&(this->super_IfcSolidModel).super_IfcGeometricRepresentationItem.field_0x30 =
       0xfe0388;
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProfileDef>::Lazy
            ((Lazy<Assimp::IFC::Schema_2x3::IfcProfileDef> *)&(this->super_IfcSolidModel).field_0x40
             ,(LazyObject *)0x0);
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>::Lazy(&this->Position,(LazyObject *)0x0);
  return;
}

Assistant:

IfcSweptAreaSolid() : Object("IfcSweptAreaSolid") {}